

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t archive_mstring_get_mbs_l
                  (archive_mstring *aes,char **p,size_t *length,archive_string_conv *sc)

{
  char *_p;
  wchar_t wVar1;
  int *piVar2;
  size_t sVar3;
  long lVar4;
  
  wVar1 = L'\0';
  if ((aes->aes_set & 5U) == 4) {
    (aes->aes_mbs).length = 0;
    wVar1 = archive_string_append_from_wcs(&aes->aes_mbs,(aes->aes_wcs).s,(aes->aes_wcs).length);
    if (wVar1 == L'\0') {
      *(byte *)&aes->aes_set = (byte)aes->aes_set | 1;
      wVar1 = L'\0';
    }
    else {
      piVar2 = __errno_location();
      wVar1 = L'\xffffffff';
      if (*piVar2 == 0xc) {
        return L'\xffffffff';
      }
    }
  }
  if ((aes->aes_set & L'\x01') == L'\0') {
    *p = (char *)0x0;
    if (length == (size_t *)0x0) {
      return wVar1;
    }
    sVar3 = 0;
  }
  else {
    if (sc == (archive_string_conv *)0x0) {
      *p = (aes->aes_mbs).s;
      lVar4 = 8;
      wVar1 = L'\0';
    }
    else {
      _p = (aes->aes_mbs).s;
      (aes->aes_mbs_in_locale).length = 0;
      wVar1 = archive_strncat_l(&aes->aes_mbs_in_locale,_p,(aes->aes_mbs).length,sc);
      *p = (aes->aes_mbs_in_locale).s;
      lVar4 = 0x50;
    }
    if (length == (size_t *)0x0) {
      return wVar1;
    }
    sVar3 = *(size_t *)((long)&(aes->aes_mbs).s + lVar4);
  }
  *length = sVar3;
  return wVar1;
}

Assistant:

int
archive_mstring_get_mbs_l(struct archive_mstring *aes,
    const char **p, size_t *length, struct archive_string_conv *sc)
{
	int r, ret = 0;

#if defined(_WIN32) && !defined(__CYGWIN__)
	/*
	 * Internationalization programming on Windows must use Wide
	 * characters because Windows platform cannot make locale UTF-8.
	 */
	if (sc != NULL && (aes->aes_set & AES_SET_WCS) != 0) {
		archive_string_empty(&(aes->aes_mbs_in_locale));
		r = archive_string_append_from_wcs_in_codepage(
		    &(aes->aes_mbs_in_locale), aes->aes_wcs.s,
		    aes->aes_wcs.length, sc);
		if (r == 0) {
			*p = aes->aes_mbs_in_locale.s;
			if (length != NULL)
				*length = aes->aes_mbs_in_locale.length;
			return (0);
		} else if (errno == ENOMEM)
			return (-1);
		else
			ret = -1;
	}
#endif

	/* If there is not an MBS form but is a WCS form, try converting
	 * with the native locale to be used for translating it to specified
	 * character-set. */
	if ((aes->aes_set & AES_SET_MBS) == 0 &&
	    (aes->aes_set & AES_SET_WCS) != 0) {
		archive_string_empty(&(aes->aes_mbs));
		r = archive_string_append_from_wcs(&(aes->aes_mbs),
		    aes->aes_wcs.s, aes->aes_wcs.length);
		if (r == 0)
			aes->aes_set |= AES_SET_MBS;
		else if (errno == ENOMEM)
			return (-1);
		else
			ret = -1;
	}
	/* If we already have an MBS form, use it to be translated to
	 * specified character-set. */
	if (aes->aes_set & AES_SET_MBS) {
		if (sc == NULL) {
			/* Conversion is unneeded. */
			*p = aes->aes_mbs.s;
			if (length != NULL)
				*length = aes->aes_mbs.length;
			return (0);
		}
		ret = archive_strncpy_l(&(aes->aes_mbs_in_locale),
		    aes->aes_mbs.s, aes->aes_mbs.length, sc);
		*p = aes->aes_mbs_in_locale.s;
		if (length != NULL)
			*length = aes->aes_mbs_in_locale.length;
	} else {
		*p = NULL;
		if (length != NULL)
			*length = 0;
	}
	return (ret);
}